

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_ary.c
# Opt level: O1

void fiobj_ary_set(FIOBJ ary,FIOBJ obj,int64_t pos)

{
  FIOBJ o;
  long lVar1;
  
  if ((((ary != 0) && ((~(uint)ary & 6) != 0)) && ((ary & 1) == 0)) &&
     (*(char *)(ary & 0xfffffffffffffff8) == ')')) {
    if (*(long *)(ary + 8) == *(long *)(ary + 0x10)) {
      ((fio_ary___s *)(ary + 8))->start = 0;
      *(undefined8 *)(ary + 0x10) = 0;
    }
    if (pos < 0) {
      pos = (pos + *(long *)(ary + 0x10)) - *(long *)(ary + 8);
      if (pos < 1) {
        pos = 0;
      }
    }
    lVar1 = (*(long *)(ary + 8) - *(long *)(ary + 0x10)) + pos;
    if (lVar1 < 0) {
      lVar1 = *(long *)(ary + 8) * 8 + *(long *)(ary + 0x20);
      o = *(FIOBJ *)(lVar1 + pos * 8);
      *(FIOBJ *)(lVar1 + pos * 8) = obj;
    }
    else {
      fio_ary_____require_on_top((fio_ary___s *)(ary + 8),lVar1 + 1);
      if (lVar1 != 0) {
        memset((void *)(*(long *)(ary + 0x10) * 8 + *(long *)(ary + 0x20)),0,lVar1 * 8);
      }
      *(FIOBJ *)(*(long *)(ary + 8) * 8 + *(long *)(ary + 0x20) + pos * 8) = obj;
      *(int64_t *)(ary + 0x10) = pos + 1;
      o = 0;
    }
    fiobj_free(o);
    return;
  }
  __assert_fail("ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_ary.c"
                ,0x8c,"void fiobj_ary_set(FIOBJ, FIOBJ, int64_t)");
}

Assistant:

void fiobj_ary_set(FIOBJ ary, FIOBJ obj, int64_t pos) {
  assert(ary && FIOBJ_TYPE_IS(ary, FIOBJ_T_ARRAY));
  FIOBJ old = FIOBJ_INVALID;
  fio_ary___set(&obj2ary(ary)->ary, pos, obj, &old);
  fiobj_free(old);
}